

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

void __thiscall Js::RootObjectBase::EnsureCanDeclGloFunc(RootObjectBase *this,PropertyId propertyId)

{
  int iVar1;
  ScriptContext *scriptContext;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  char16 *varName;
  PropertyId propertyId_local;
  RootObjectBase *this_local;
  
  iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])
                    (this,(ulong)(uint)propertyId);
  if (iVar1 == 0) {
    iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x30])
                      (this,(ulong)(uint)propertyId);
    if (iVar1 == 0) {
      iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x32])
                        (this,(ulong)(uint)propertyId);
      if (iVar1 == 0) {
        scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
        varName = PropertyRecord::GetBuffer(this_01);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9d1,varName);
      }
    }
  }
  return;
}

Assistant:

void
    RootObjectBase::EnsureCanDeclGloFunc(PropertyId propertyId)
    {
        // #sec-candeclareglobalfunction states that if an exisiting property is
        // not configurable, not writable, and not enumerable, return false.
        if (!IsConfigurable(propertyId) && !IsWritable(propertyId) && !IsEnumerable(propertyId))
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_InvalidGloFuncDecl,
                GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());
        }
    }